

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  anon_class_8_1_4dc591dd local_190;
  function<void_()> local_188;
  future<int> add_future;
  promise<int> add_promise;
  duration<long,_std::ratio<1L,_1000L>_> local_138;
  _Bind<int_(*(const_char_*))(const_char_*,____)> local_130;
  function<void_()> local_120;
  char *local_100;
  char *str;
  function<void_()> local_f0;
  int local_cc;
  undefined1 local_c8 [4];
  int j;
  function<void_()> local_a8;
  function<void_()> local_88;
  anon_class_1_0_00000001 local_51;
  function<void_()> local_50;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  thread_pool pool;
  char **argv_local;
  int argc_local;
  
  pool.data_.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  ycqian::thread_pool::thread_pool((thread_pool *)local_28,8);
  for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
    std::function<void()>::function<main::__0,void>((function<void()> *)&local_50,&local_51);
    ycqian::thread_pool::execute((thread_pool *)local_28,&local_50);
    std::function<void_()>::~function(&local_50);
  }
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_88,foo);
  ycqian::thread_pool::execute((thread_pool *)local_28,&local_88);
  std::function<void_()>::~function(&local_88);
  std::function<void()>::function<int(&)(),void>((function<void()> *)&local_a8,bar);
  ycqian::thread_pool::execute((thread_pool *)local_28,&local_a8);
  std::function<void_()>::~function(&local_a8);
  std::function<void()>::function<A(&)(),void>((function<void()> *)local_c8,var);
  ycqian::thread_pool::execute((thread_pool *)local_28,(function<void_()> *)local_c8);
  std::function<void_()>::~function((function<void_()> *)local_c8);
  for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
    str._4_4_ = local_cc;
    std::function<void()>::function<main::__1,void>
              ((function<void()> *)&local_f0,(anon_class_4_1_54a3980a *)((long)&str + 4));
    ycqian::thread_pool::execute((thread_pool *)local_28,&local_f0);
    std::function<void_()>::~function(&local_f0);
  }
  local_100 = "msgmsgmsgmsgmsgmsgmsg";
  std::bind<int(&)(char_const*,___),char_const*&>
            ((_func_int_char_ptr_varargs *)&local_130,(char **)printf);
  std::function<void()>::function<std::_Bind<int(*(char_const*))(char_const*,___)>,void>
            ((function<void()> *)&local_120,&local_130);
  ycqian::thread_pool::execute((thread_pool *)local_28,&local_120);
  std::function<void_()>::~function(&local_120);
  add_promise._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl._4_4_ = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_138,
             (int *)((long)&add_promise._M_storage._M_t.
                            super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
                            .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false> + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_138);
  std::promise<int>::promise
            ((promise<int> *)
             &add_future.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<int>::get_future((promise<int> *)&stack0xfffffffffffffe98);
  local_190.add_promise =
       (promise<int> *)
       &add_future.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  std::function<void()>::function<main::__2,void>((function<void()> *)&local_188,&local_190);
  ycqian::thread_pool::execute((thread_pool *)local_28,&local_188);
  std::function<void_()>::~function(&local_188);
  poVar2 = std::operator<<((ostream *)&std::cout,"the result = ");
  iVar1 = std::future<int>::get((future<int> *)&stack0xfffffffffffffe98);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::future<int>::~future((future<int> *)&stack0xfffffffffffffe98);
  std::promise<int>::~promise
            ((promise<int> *)
             &add_future.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ycqian::thread_pool::~thread_pool((thread_pool *)local_28);
  return 0;
}

Assistant:

int main(int argc, char **argv){
    ycqian::thread_pool pool(8);

    /**
     * calling lambda expression
     */
    for (int i = 0; i < 10; ++i) {
        pool.execute([] {
            std::cout << std::this_thread::get_id() << " do sth...\n";
        });
    }

    /**
     * calling method
     */
    pool.execute(foo);
    pool.execute(bar);
    pool.execute(var);

    /**
     * passing parameters with lambda expression
     */
    for (int j = 0; j < 4; ++j) {
        pool.execute([j] {
            std::cout << "task-" << j << std::endl;
        });
    }

    /**
     * passing parameters with std::bind
     */
    const char *str = "msgmsgmsgmsgmsgmsgmsg";
    pool.execute(std::bind(printf, str));

    /**
     * wait some time to see the output
     */
    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    /**
     * getting return value
     */
    std::promise<int>add_promise;
    std::future<int> add_future = add_promise.get_future();
    pool.execute([&add_promise] {
        //do some task
        add_promise.set_value(10);
    });
    std::cout << "the result = " << add_future.get() << std::endl;
}